

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

bool __thiscall relive::LogManager::isActive(LogManager *this,string *className,int level)

{
  int iVar1;
  bool bVar2;
  pointer ppVar3;
  mutex_type *in_stack_ffffffffffffff58;
  lock_guard<std::mutex> *in_stack_ffffffffffffff60;
  iterator local_80;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_78 [3];
  string local_60;
  iterator local_40;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_38;
  const_iterator i;
  lock_guard<std::mutex> lock;
  int level_local;
  string *className_local;
  LogManager *this_local;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  detemplatedClassName(&local_60,className);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(&this->_logLevels,&local_60);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::_Rb_tree_const_iterator(&local_38,&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  local_80._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end(&this->_logLevels);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::_Rb_tree_const_iterator(local_78,&local_80);
  bVar2 = std::operator!=(&local_38,local_78);
  if (bVar2) {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_38);
    iVar1 = ppVar3->second;
  }
  else {
    iVar1 = this->_defaultLevel;
  }
  this_local._7_1_ = level <= iVar1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x275fe6);
  return this_local._7_1_;
}

Assistant:

bool LogManager::isActive(const std::string& className, int level)
{
    std::lock_guard<std::mutex> lock(_mutex);
    LogLevels::const_iterator i = _logLevels.find(detemplatedClassName(className));
    if(i != _logLevels.end())
    {
        return i->second >= level;
    }
    else
    {
        return _defaultLevel >= level;
    }    
}